

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regalloc.cpp
# Opt level: O1

Error __thiscall asmjit::RAPass::removeUnreachableCode(RAPass *this)

{
  CBNode *pCVar1;
  CBNode *pCVar2;
  byte bVar3;
  CBNode *node;
  CBNode *pCVar4;
  byte bVar5;
  Link *pLVar6;
  
  pLVar6 = (this->_unreachableList)._first;
  if (pLVar6 != (Link *)0x0) {
    pCVar1 = this->_stop;
    do {
      node = pLVar6->_value;
      if (((node != (CBNode *)0x0) && (node != pCVar1)) &&
         (pCVar4 = node, node->_prev != (CBNode *)0x0)) {
        do {
          if (pCVar4->_passData != (void *)0x0) break;
          pCVar4 = pCVar4->_next;
        } while (pCVar4 != pCVar1);
        if (pCVar4 != node) {
          bVar5 = 1;
          do {
            bVar3 = ((byte)node->_flags & 4) >> 2;
            if ((bVar3 == 0) && (bVar3 = bVar5, node->_type == '\x04')) {
              bVar3 = 0;
              bVar5 = bVar3;
            }
            pCVar2 = node->_next;
            if (bVar3 != 0) {
              CodeBuilder::removeNode((this->super_CBPass)._cb,node);
            }
            node = pCVar2;
          } while (pCVar2 != pCVar4);
        }
      }
      pLVar6 = pLVar6->_next;
    } while (pLVar6 != (Link *)0x0);
  }
  return 0;
}

Assistant:

Error RAPass::removeUnreachableCode() {
  ZoneList<CBNode*>::Link* link = _unreachableList.getFirst();
  CBNode* stop = getStop();

  while (link) {
    CBNode* node = link->getValue();
    if (node && node->getPrev() && node != stop) {
      // Locate all unreachable nodes.
      CBNode* first = node;
      do {
        if (node->hasPassData()) break;
        node = node->getNext();
      } while (node != stop);

      // Remove unreachable nodes that are neither informative nor directives.
      if (node != first) {
        CBNode* end = node;
        node = first;

        // NOTE: The strategy is as follows:
        // 1. The algorithm removes everything until it finds a first label.
        // 2. After the first label is found it removes only removable nodes.
        bool removeEverything = true;
        do {
          CBNode* next = node->getNext();
          bool remove = node->isRemovable();

          if (!remove) {
            if (node->isLabel())
              removeEverything = false;
            remove = removeEverything;
          }

          if (remove)
            cc()->removeNode(node);

          node = next;
        } while (node != end);
      }
    }

    link = link->getNext();
  }

  return kErrorOk;
}